

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int read_exttime(char *p,rar *rar,char *endp)

{
  ushort uVar1;
  int iVar2;
  ushort uVar3;
  uint uVar4;
  tm *__tp;
  time_t *ptVar5;
  long lVar6;
  long *plVar7;
  int iVar8;
  uint uVar9;
  uchar *p_2;
  int *piVar10;
  bool bVar11;
  time_t t;
  time_t local_88;
  int *local_80;
  long *local_78;
  time_t *local_70;
  long *local_68;
  time_t *local_60;
  long *local_58;
  time_t *local_50;
  long *local_48;
  time_t *local_40;
  rar *local_38;
  
  piVar10 = (int *)(p + 2);
  iVar8 = -1;
  if (piVar10 <= endp) {
    uVar1 = *(ushort *)p;
    local_60 = &rar->atime;
    local_68 = &rar->ansec;
    local_50 = &rar->ctime;
    local_58 = &rar->cnsec;
    local_70 = &rar->arctime;
    local_78 = &rar->arcnsec;
    local_40 = &rar->mtime;
    local_48 = &rar->mnsec;
    iVar8 = 3;
    local_80 = (int *)endp;
    local_38 = rar;
    do {
      local_88 = 0;
      if (iVar8 == 3) {
        local_88 = rar->mtime;
      }
      uVar3 = uVar1 >> ((char)iVar8 * '\x04' & 0x1fU);
      if ((uVar3 & 8) != 0) {
        if (local_88 == 0) {
          if (local_80 < piVar10 + 1) {
            return -1;
          }
          local_88 = get_time(*piVar10);
          piVar10 = piVar10 + 1;
        }
        uVar4 = uVar3 & 3;
        if (local_80 < (int *)((long)piVar10 + (ulong)uVar4)) {
          return -1;
        }
        if ((ulong)uVar4 == 0) {
          uVar4 = 0;
        }
        else {
          lVar6 = 0;
          uVar9 = 0;
          do {
            uVar9 = uVar9 >> 8 | (uint)*(byte *)((long)piVar10 + lVar6) << 0x10;
            lVar6 = lVar6 + 1;
          } while (uVar4 != (uint)lVar6);
          piVar10 = (int *)((long)piVar10 + (ulong)(uVar4 - 1) + 1);
          uVar4 = (uint)((ulong)uVar9 * 0x6b5fcb >> 0x2e);
        }
        __tp = localtime(&local_88);
        iVar2 = __tp->tm_sec;
        if ((uVar3 & 4) != 0) {
          __tp->tm_sec = iVar2 + 1;
          local_88 = mktime(__tp);
        }
        ptVar5 = local_40;
        plVar7 = local_48;
        if (((iVar8 != 3) && (ptVar5 = local_50, plVar7 = local_58, iVar8 != 2)) &&
           (ptVar5 = local_60, plVar7 = local_68, iVar8 != 1)) {
          ptVar5 = local_70;
          plVar7 = local_78;
        }
        *ptVar5 = local_88;
        *plVar7 = (ulong)(iVar2 + uVar4);
        rar = local_38;
      }
      bVar11 = iVar8 != 0;
      iVar8 = iVar8 + -1;
    } while (bVar11);
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int
read_exttime(const char *p, struct rar *rar, const char *endp)
{
  unsigned rmode, flags, rem, j, count;
  int ttime, i;
  struct tm *tm;
  time_t t;
  long nsec;

  if (p + 2 > endp)
    return (-1);
  flags = archive_le16dec(p);
  p += 2;

  for (i = 3; i >= 0; i--)
  {
    t = 0;
    if (i == 3)
      t = rar->mtime;
    rmode = flags >> i * 4;
    if (rmode & 8)
    {
      if (!t)
      {
        if (p + 4 > endp)
          return (-1);
        ttime = archive_le32dec(p);
        t = get_time(ttime);
        p += 4;
      }
      rem = 0;
      count = rmode & 3;
      if (p + count > endp)
        return (-1);
      for (j = 0; j < count; j++)
      {
        rem = (((unsigned)(unsigned char)*p) << 16) | (rem >> 8);
        p++;
      }
      tm = localtime(&t);
      nsec = tm->tm_sec + rem / NS_UNIT;
      if (rmode & 4)
      {
        tm->tm_sec++;
        t = mktime(tm);
      }
      if (i == 3)
      {
        rar->mtime = t;
        rar->mnsec = nsec;
      }
      else if (i == 2)
      {
        rar->ctime = t;
        rar->cnsec = nsec;
      }
      else if (i == 1)
      {
        rar->atime = t;
        rar->ansec = nsec;
      }
      else
      {
        rar->arctime = t;
        rar->arcnsec = nsec;
      }
    }
  }
  return (0);
}